

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_kint(jit_State *J,int32_t k)

{
  ushort uVar1;
  IRIns *pIVar2;
  IRRef2 in_ESI;
  jit_State *in_RDI;
  IRRef ref;
  IRIns *cir;
  IRIns *ir;
  IRRef ref_1;
  uint local_34;
  jit_State *pjVar3;
  
  pIVar2 = (in_RDI->cur).ir;
  uVar1 = in_RDI->chain[0x16];
  while (local_34 = (uint)uVar1, local_34 != 0) {
    if (pIVar2[local_34].field_1.op12 == in_ESI) goto LAB_0013e7f0;
    uVar1 = *(ushort *)((long)pIVar2 + (ulong)local_34 * 8 + 6);
  }
  local_34 = (in_RDI->cur).nk;
  pjVar3 = in_RDI;
  if (local_34 <= in_RDI->irbotlim) {
    lj_ir_growbot(in_RDI);
  }
  local_34 = local_34 - 1;
  (in_RDI->cur).nk = local_34;
  pIVar2 = (pjVar3->cur).ir + local_34;
  (pIVar2->field_1).op12 = in_ESI;
  (pIVar2->field_1).t.irt = '\x13';
  (pIVar2->field_1).o = '\x16';
  (pIVar2->field_0).prev = pjVar3->chain[0x16];
  pjVar3->chain[0x16] = (IRRef1)local_34;
LAB_0013e7f0:
  return local_34 + 0x13000000;
}

Assistant:

TRef LJ_FASTCALL lj_ir_kint(jit_State *J, int32_t k)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  for (ref = J->chain[IR_KINT]; ref; ref = cir[ref].prev)
    if (cir[ref].i == k)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  ir->i = k;
  ir->t.irt = IRT_INT;
  ir->o = IR_KINT;
  ir->prev = J->chain[IR_KINT];
  J->chain[IR_KINT] = (IRRef1)ref;
found:
  return TREF(ref, IRT_INT);
}